

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldisc.c
# Opt level: O2

LdiscInputToken ldisc_get_input_token(Ldisc *ldisc)

{
  uint uVar1;
  size_t sVar2;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint uVar3;
  ulong uVar4;
  bufchain *ch;
  LdiscInputToken LVar5;
  char c;
  char data [8];
  
  ch = &ldisc->input_queue;
  sVar2 = bufchain_size(ch);
  if (sVar2 == 0) {
    __assert_fail("bufchain_size(&ldisc->input_queue) > 0 && \"You\'re not supposed to call this unless there is buffered input!\""
                  ,"/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ldisc.c",0x120
                  ,"LdiscInputToken ldisc_get_input_token(Ldisc *)");
  }
  bufchain_fetch_consume(ch,&c,1);
  uVar3 = extraout_EDX;
  if (c == -1) {
    uVar4 = 1;
    bufchain_fetch_consume(ch,data,1);
    if (data[0] != -1) {
      bufchain_fetch_consume(ch,data + 1,7);
      uVar1 = (uint)(byte)data[0] << 0x18 | (uint)(byte)data[1] << 0x10 | (uint)(byte)data[2] << 8;
      uVar3 = (uint)data._4_4_ >> 0x18 | (data._4_4_ & 0xff0000) >> 8 | (data._4_4_ & 0xff00) << 8 |
              data._4_4_ << 0x18;
      c = data[3];
      goto LAB_00112d85;
    }
    c = 0xff;
    uVar3 = extraout_EDX_00;
  }
  uVar4 = 0;
  uVar1 = 0;
LAB_00112d85:
  LVar5._0_8_ = (ulong)(uVar1 | (byte)c) << 0x20 | uVar4;
  LVar5.field_1.field_1.arg = uVar3;
  return LVar5;
}

Assistant:

LdiscInputToken ldisc_get_input_token(Ldisc *ldisc)
{
    assert(bufchain_size(&ldisc->input_queue) > 0 &&
           "You're not supposed to call this unless there is buffered input!");

    LdiscInputToken tok;

    char c;
    bufchain_fetch_consume(&ldisc->input_queue, &c, 1);
    if (c != '\xFF') {
        /* A literal non-FF byte */
        tok.is_special = false;
        tok.chr = c;
        return tok;
    } else {
        char data[8];

        /* See if the byte after the FF is also FF, indicating a literal FF */
        bufchain_fetch_consume(&ldisc->input_queue, data, 1);
        if (data[0] == '\xFF') {
            tok.is_special = false;
            tok.chr = '\xFF';
            return tok;
        }

        /* If not, get the rest of an 8-byte chunk and decode a special */
        bufchain_fetch_consume(&ldisc->input_queue, data+1, 7);
        tok.is_special = true;
        tok.code = GET_32BIT_MSB_FIRST(data);
        tok.arg = toint(GET_32BIT_MSB_FIRST(data+4));
        return tok;
    }
}